

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.cpp
# Opt level: O2

void __thiscall ALCcontext::setError(ALCcontext *this,ALenum errorCode,char *msg,...)

{
  char in_AL;
  uint uVar1;
  int iVar2;
  undefined8 in_RCX;
  undefined8 in_R8;
  char *pcVar3;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  vector<char> message;
  va_list args2;
  va_list args;
  undefined1 local_e8 [24];
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  std::vector<char,_al::allocator<char,_1UL>_>::vector(&message,0x100,(allocator_type *)args);
  args[0].gp_offset = 0x18;
  args[0].fp_offset = 0x30;
  args2[0].overflow_arg_area = &stack0x00000008;
  args2[0].gp_offset = 0x18;
  args2[0].fp_offset = 0x30;
  args2[0].reg_save_area = local_e8;
  args[0].overflow_arg_area = args2[0].overflow_arg_area;
  args[0].reg_save_area = local_e8;
  uVar1 = vsnprintf(message.super__Vector_base<char,_al::allocator<char,_1UL>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)message.super__Vector_base<char,_al::allocator<char,_1UL>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)message.super__Vector_base<char,_al::allocator<char,_1UL>_>._M_impl.
                          super__Vector_impl_data._M_start,msg,args);
  if (-1 < (int)uVar1) {
    pcVar3 = message.super__Vector_base<char,_al::allocator<char,_1UL>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)uVar1 <
        (ulong)((long)message.super__Vector_base<char,_al::allocator<char,_1UL>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)message.super__Vector_base<char,_al::allocator<char,_1UL>_>._M_impl.
                     super__Vector_impl_data._M_start)) goto LAB_0011c5d0;
    std::vector<char,_al::allocator<char,_1UL>_>::resize(&message,(ulong)uVar1 + 1);
    iVar2 = vsnprintf(message.super__Vector_base<char,_al::allocator<char,_1UL>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)message.super__Vector_base<char,_al::allocator<char,_1UL>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)message.super__Vector_base<char,_al::allocator<char,_1UL>_>._M_impl.
                            super__Vector_impl_data._M_start,msg,args2);
    pcVar3 = message.super__Vector_base<char,_al::allocator<char,_1UL>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (-1 < iVar2) goto LAB_0011c5d0;
  }
  pcVar3 = "<internal error constructing message>";
LAB_0011c5d0:
  if (1 < (int)gLogLevel) {
    fprintf((FILE *)gLogFile,"[ALSOFT] (WW) Error generated on context %p, code 0x%04x, \"%s\"\n",
            this,errorCode,pcVar3);
  }
  if (TrapALError == true) {
    raise(5);
  }
  LOCK();
  if ((this->mLastError).super___atomic_base<int>._M_i == 0) {
    (this->mLastError).super___atomic_base<int>._M_i = errorCode;
  }
  UNLOCK();
  std::_Vector_base<char,_al::allocator<char,_1UL>_>::~_Vector_base
            (&message.super__Vector_base<char,_al::allocator<char,_1UL>_>);
  return;
}

Assistant:

void ALCcontext::setError(ALenum errorCode, const char *msg, ...)
{
    auto message = al::vector<char>(256);

    va_list args, args2;
    va_start(args, msg);
    va_copy(args2, args);
    int msglen{std::vsnprintf(message.data(), message.size(), msg, args)};
    if(msglen >= 0 && static_cast<size_t>(msglen) >= message.size())
    {
        message.resize(static_cast<size_t>(msglen) + 1u);
        msglen = std::vsnprintf(message.data(), message.size(), msg, args2);
    }
    va_end(args2);
    va_end(args);

    if(msglen >= 0) msg = message.data();
    else msg = "<internal error constructing message>";

    WARN("Error generated on context %p, code 0x%04x, \"%s\"\n",
        decltype(std::declval<void*>()){this}, errorCode, msg);
    if(TrapALError)
    {
#ifdef _WIN32
        /* DebugBreak will cause an exception if there is no debugger */
        if(IsDebuggerPresent())
            DebugBreak();
#elif defined(SIGTRAP)
        raise(SIGTRAP);
#endif
    }

    ALenum curerr{AL_NO_ERROR};
    mLastError.compare_exchange_strong(curerr, errorCode);
}